

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

UA_StatusCode UA_SecureChannel_sendChunk(UA_ChunkInfo *ci,UA_ByteString *dst,size_t offset)

{
  uint uVar1;
  UA_UInt32 UVar2;
  UA_SecureChannel *pUVar3;
  UA_Connection *pUVar4;
  size_t sVar5;
  UA_StatusCode UVar6;
  uint uVar7;
  ulong uVar8;
  size_t sVar9;
  undefined8 uStack_68;
  UA_SequenceHeader seqHeader;
  int local_40;
  undefined4 local_3c;
  UA_SecureConversationMessageHeader respHeader;
  UA_SymmetricAlgorithmSecurityHeader symSecHeader;
  
  pUVar3 = ci->channel;
  pUVar4 = pUVar3->connection;
  if (pUVar4 == (UA_Connection *)0x0) {
    UVar6 = 0x80020000;
  }
  else {
    sVar5 = dst->length;
    pos = dst->data;
    dst->data = pos + -0x18;
    dst->length = sVar5 + 0x18;
    sVar9 = offset + 0x18;
    uVar8 = (ulong)(pUVar4->remoteConf).maxMessageSize;
    if ((uVar8 != 0) && (uVar8 < ci->messageSizeSoFar + sVar9)) {
      ci->errorCode = 0x80b90000;
    }
    uVar7 = *(int *)&ci->chunksSoFar + 1;
    ci->chunksSoFar = (UA_UInt16)uVar7;
    uVar1 = (pUVar4->remoteConf).maxChunkCount;
    if (uVar1 != 0 && uVar1 < (uVar7 & 0xffff)) {
      ci->errorCode = 0x80b90000;
    }
    respHeader.messageHeader.messageTypeAndChunkType = (pUVar3->securityToken).channelId;
    UVar2 = ci->messageType;
    if (ci->errorCode == 0) {
      if (ci->final == true) {
        local_40 = UVar2 + 0x46000000;
      }
      else {
        local_40 = UVar2 + 0x43000000;
      }
    }
    else {
      ci->final = true;
      local_40 = UVar2 + 0x41000000;
      uStack_68 = 0;
      seqHeader.sequenceNumber = 0;
      seqHeader.requestId = 0;
      end = pos + sVar5;
      exchangeBufferCallback = (UA_exchangeEncodeBuffer)0x0;
      exchangeBufferCallbackHandle = (void *)0x0;
      encodeBuf = dst;
      UA_encodeBinaryInternal(&ci->errorCode,UA_TYPES + 6);
      end = dst->data + dst->length;
      exchangeBufferCallback = (UA_exchangeEncodeBuffer)0x0;
      exchangeBufferCallbackHandle = (void *)0x0;
      encodeBuf = dst;
      UA_encodeBinaryInternal(&uStack_68,UA_TYPES + 0xb);
      sVar9 = (long)pos - (long)dst->data;
    }
    local_3c = (undefined4)sVar9;
    ci->messageSizeSoFar = ci->messageSizeSoFar + sVar9;
    respHeader.messageHeader.messageSize = (pUVar3->securityToken).tokenId;
    UVar2 = ci->requestId;
    pUVar3->sendSequenceNumber = pUVar3->sendSequenceNumber + 1;
    uStack_68 = CONCAT44(UVar2,pUVar3->sendSequenceNumber);
    pos = dst->data;
    end = pos + dst->length;
    exchangeBufferCallback = (UA_exchangeEncodeBuffer)0x0;
    exchangeBufferCallbackHandle = (void *)0x0;
    encodeBuf = dst;
    UA_encodeBinaryInternal(&local_40,UA_TRANSPORT + 0xb);
    end = dst->data + dst->length;
    exchangeBufferCallback = (UA_exchangeEncodeBuffer)0x0;
    exchangeBufferCallbackHandle = (void *)0x0;
    encodeBuf = dst;
    UA_encodeBinaryInternal(&respHeader.messageHeader.messageSize,UA_TRANSPORT + 10);
    end = dst->data + dst->length;
    exchangeBufferCallback = (UA_exchangeEncodeBuffer)0x0;
    exchangeBufferCallbackHandle = (void *)0x0;
    encodeBuf = dst;
    UA_encodeBinaryInternal(&uStack_68,UA_TRANSPORT + 7);
    dst->length = sVar9;
    (*pUVar4->send)(pUVar3->connection,dst);
    if (ci->final == false) {
      UVar6 = (*pUVar4->getSendBuffer)(pUVar4,(size_t)(pUVar4->localConf).sendBufferSize,dst);
      if (UVar6 != 0) {
        return UVar6;
      }
      dst->data = dst->data + 0x18;
      dst->length = (ulong)((pUVar4->localConf).sendBufferSize - 0x18);
    }
    UVar6 = ci->errorCode;
  }
  return UVar6;
}

Assistant:

static UA_StatusCode
UA_SecureChannel_sendChunk(UA_ChunkInfo *ci, UA_ByteString *dst, size_t offset) {
    UA_SecureChannel *channel = ci->channel;
    UA_Connection *connection = channel->connection;
    if(!connection)
       return UA_STATUSCODE_BADINTERNALERROR;

    /* adjust the buffer where the header was hidden */
    dst->data = &dst->data[-UA_SECURE_MESSAGE_HEADER_LENGTH];
    dst->length += UA_SECURE_MESSAGE_HEADER_LENGTH;
    offset += UA_SECURE_MESSAGE_HEADER_LENGTH;

    if(ci->messageSizeSoFar + offset > connection->remoteConf.maxMessageSize &&
       connection->remoteConf.maxMessageSize > 0)
        ci->errorCode = UA_STATUSCODE_BADRESPONSETOOLARGE;
    if(++ci->chunksSoFar > connection->remoteConf.maxChunkCount &&
       connection->remoteConf.maxChunkCount > 0)
        ci->errorCode = UA_STATUSCODE_BADRESPONSETOOLARGE;

    /* Prepare the chunk headers */
    UA_SecureConversationMessageHeader respHeader;
    respHeader.secureChannelId = channel->securityToken.channelId;
    respHeader.messageHeader.messageTypeAndChunkType = ci->messageType;
    if(ci->errorCode == UA_STATUSCODE_GOOD) {
        if(ci->final)
            respHeader.messageHeader.messageTypeAndChunkType += UA_CHUNKTYPE_FINAL;
        else
            respHeader.messageHeader.messageTypeAndChunkType += UA_CHUNKTYPE_INTERMEDIATE;
    } else {
        /* abort message */
        ci->final = true; /* mark as finished */
        respHeader.messageHeader.messageTypeAndChunkType += UA_CHUNKTYPE_ABORT;
        UA_String errorMsg;
        UA_String_init(&errorMsg);
        offset = UA_SECURE_MESSAGE_HEADER_LENGTH;
        UA_UInt32_encodeBinary(&ci->errorCode, dst, &offset);
        UA_String_encodeBinary(&errorMsg, dst, &offset);
    }
    respHeader.messageHeader.messageSize = (UA_UInt32)offset;
    ci->messageSizeSoFar += offset;

    /* Encode the header at the beginning of the buffer */
    UA_SymmetricAlgorithmSecurityHeader symSecHeader;
    symSecHeader.tokenId = channel->securityToken.tokenId;
    UA_SequenceHeader seqHeader;
    seqHeader.requestId = ci->requestId;
    seqHeader.sequenceNumber = UA_atomic_add(&channel->sendSequenceNumber, 1);
    size_t offset_header = 0;
    UA_SecureConversationMessageHeader_encodeBinary(&respHeader, dst, &offset_header);
    UA_SymmetricAlgorithmSecurityHeader_encodeBinary(&symSecHeader, dst, &offset_header);
    UA_SequenceHeader_encodeBinary(&seqHeader, dst, &offset_header);

    /* Send the chunk, the buffer is freed in the network layer */
    dst->length = offset; /* set the buffer length to the content length */
    connection->send(channel->connection, dst);

    /* Replace with the buffer for the next chunk */
    if(!ci->final) {
        UA_StatusCode retval =
            connection->getSendBuffer(connection, connection->localConf.sendBufferSize, dst);
        if(retval != UA_STATUSCODE_GOOD)
            return retval;
        /* Forward the data pointer so that the payload is encoded after the message header.
         * TODO: This works but is a bit too clever. Instead, we could return an offset to the
         * binary encoding exchangeBuffer function. */
        dst->data = &dst->data[UA_SECURE_MESSAGE_HEADER_LENGTH];
        dst->length = connection->localConf.sendBufferSize - UA_SECURE_MESSAGE_HEADER_LENGTH;
    }
    return ci->errorCode;
}